

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O1

string * __thiscall CLI::App::_compare_subcommand_names_abi_cxx11_(App *this,App *subcom,App *base)

{
  pointer psVar1;
  size_type sVar2;
  pointer pcVar3;
  element_type *peVar4;
  App *pAVar5;
  bool bVar6;
  bool bVar7;
  App *pAVar8;
  pointer psVar9;
  char cVar10;
  App *local_c8;
  string local_b8;
  App *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  if (_compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)::estring_abi_cxx11_ ==
      '\0') {
    _compare_subcommand_names_abi_cxx11_();
  }
  if (subcom->disabled_ == false) {
    psVar9 = (base->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (base->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar9 != psVar1) {
      local_98 = this;
      do {
        pAVar8 = (psVar9->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_c8 = this;
        if (pAVar8 == subcom) {
LAB_0012f619:
          cVar10 = '\0';
        }
        else {
          cVar10 = '\x03';
          if (pAVar8->disabled_ == false) {
            sVar2 = (subcom->name_)._M_string_length;
            if (sVar2 != 0) {
              pcVar3 = (subcom->name_)._M_dataplus._M_p;
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              ::std::__cxx11::string::_M_construct<char*>((string *)&local_90,pcVar3,pcVar3 + sVar2)
              ;
              bVar6 = check_name(pAVar8,&local_90);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p);
              }
              cVar10 = '\x01';
              local_c8 = (App *)&subcom->name_;
              if (bVar6) goto LAB_0012f61e;
            }
            peVar4 = (psVar9->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            sVar2 = (peVar4->name_)._M_string_length;
            if (sVar2 != 0) {
              pcVar3 = (peVar4->name_)._M_dataplus._M_p;
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              ::std::__cxx11::string::_M_construct<char*>((string *)&local_b8,pcVar3,pcVar3 + sVar2)
              ;
              bVar6 = check_name(subcom,&local_b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p);
              }
              if (bVar6) {
                local_c8 = (App *)&((psVar9->
                                    super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                                   )->name_;
                cVar10 = '\x01';
                goto LAB_0012f61e;
              }
            }
            pAVar8 = (App *)(subcom->aliases_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
            for (local_c8 = (App *)(subcom->aliases_).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                bVar6 = local_c8 != pAVar8, bVar6;
                local_c8 = (App *)((local_c8->name_).field_2._M_local_buf + 8)) {
              pAVar5 = (psVar9->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              pcVar3 = ((_Alloc_hider *)&local_c8->_vptr_App)->_M_p;
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,pcVar3,
                         (local_c8->name_)._M_dataplus._M_p + (long)pcVar3);
              bVar7 = check_name(pAVar5,&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p);
              }
              if (bVar7) {
                cVar10 = '\x01';
                goto LAB_0012f52a;
              }
            }
            cVar10 = '\x04';
            local_c8 = this;
LAB_0012f52a:
            if (!bVar6) {
              peVar4 = (psVar9->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              pAVar5 = (App *)(peVar4->aliases_).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
              for (pAVar8 = (App *)(peVar4->aliases_).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                  bVar6 = pAVar8 == pAVar5, !bVar6;
                  pAVar8 = (App *)((pAVar8->name_).field_2._M_local_buf + 8)) {
                pcVar3 = ((_Alloc_hider *)&pAVar8->_vptr_App)->_M_p;
                local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_70,pcVar3,
                           (pAVar8->name_)._M_dataplus._M_p + (long)pcVar3);
                bVar7 = check_name(subcom,&local_70);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != &local_70.field_2) {
                  operator_delete(local_70._M_dataplus._M_p);
                }
                if (bVar7) {
                  cVar10 = '\x01';
                  local_c8 = pAVar8;
                  goto LAB_0012f5ec;
                }
              }
              cVar10 = '\x06';
LAB_0012f5ec:
              if (bVar6) {
                pAVar8 = (psVar9->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                if ((pAVar8->name_)._M_string_length == 0) {
                  pAVar8 = (App *)_compare_subcommand_names_abi_cxx11_(local_98,subcom,pAVar8);
                  bVar6 = (pAVar8->name_)._M_dataplus._M_p != (pointer)0x0;
                  if (bVar6) {
                    local_c8 = pAVar8;
                  }
                  cVar10 = '\x01';
                  if (bVar6) goto LAB_0012f61e;
                }
                if ((subcom->name_)._M_string_length != 0) goto LAB_0012f619;
                pAVar8 = (App *)_compare_subcommand_names_abi_cxx11_
                                          (local_98,(psVar9->
                                                  super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr,subcom);
                cVar10 = (pAVar8->name_)._M_dataplus._M_p != (pointer)0x0;
                if ((bool)cVar10) {
                  local_c8 = pAVar8;
                }
              }
            }
          }
        }
LAB_0012f61e:
        if ((cVar10 != '\x03') && (cVar10 != '\0')) {
          return (string *)local_c8;
        }
        psVar9 = psVar9 + 1;
        this = local_c8;
      } while (psVar9 != psVar1);
    }
  }
  return (string *)
         &_compare_subcommand_names[abi:cxx11](CLI::App_const&,CLI::App_const&)::estring_abi_cxx11_;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE const std::string &App::_compare_subcommand_names(const App &subcom,
                                                                               const App &base) const {
    static const std::string estring;
    if(subcom.disabled_) {
        return estring;
    }
    for(const auto &subc : base.subcommands_) {
        if(subc.get() != &subcom) {
            if(subc->disabled_) {
                continue;
            }
            if(!subcom.get_name().empty()) {
                if(subc->check_name(subcom.get_name())) {
                    return subcom.get_name();
                }
            }
            if(!subc->get_name().empty()) {
                if(subcom.check_name(subc->get_name())) {
                    return subc->get_name();
                }
            }
            for(const auto &les : subcom.aliases_) {
                if(subc->check_name(les)) {
                    return les;
                }
            }
            // this loop is needed in case of ignore_underscore or ignore_case on one but not the other
            for(const auto &les : subc->aliases_) {
                if(subcom.check_name(les)) {
                    return les;
                }
            }
            // if the subcommand is an option group we need to check deeper
            if(subc->get_name().empty()) {
                const auto &cmpres = _compare_subcommand_names(subcom, *subc);
                if(!cmpres.empty()) {
                    return cmpres;
                }
            }
            // if the test subcommand is an option group we need to check deeper
            if(subcom.get_name().empty()) {
                const auto &cmpres = _compare_subcommand_names(*subc, subcom);
                if(!cmpres.empty()) {
                    return cmpres;
                }
            }
        }
    }
    return estring;
}